

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall
bssl::ConsumeExtension
          (bssl *this,Input oid,
          map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
          *unconsumed_extensions,ParsedExtension *extension)

{
  bool bVar1;
  pointer ppVar2;
  map<bssl::der::Input,bssl::ParsedExtension,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>>
  *this_00;
  _Self local_40;
  _Self local_38;
  iterator it;
  ParsedExtension *extension_local;
  map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
  *unconsumed_extensions_local;
  Input oid_local;
  
  this_00 = (map<bssl::der::Input,bssl::ParsedExtension,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>>
             *)oid.data_.size_;
  oid_local.data_.data_ = oid.data_.data_;
  it._M_node = (_Base_ptr)unconsumed_extensions;
  unconsumed_extensions_local =
       (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
        *)this;
  local_38._M_node =
       (_Base_ptr)
       ::std::
       map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
       ::find((map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
               *)this_00,(key_type *)&unconsumed_extensions_local);
  local_40._M_node =
       (_Base_ptr)
       ::std::
       map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
       ::end((map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
              *)this_00);
  bVar1 = ::std::operator==(&local_38,&local_40);
  if (!bVar1) {
    ppVar2 = ::std::_Rb_tree_iterator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>::
             operator->(&local_38);
    memcpy(it._M_node,&ppVar2->second,0x21);
    ::std::
    map<bssl::der::Input,bssl::ParsedExtension,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>>
    ::erase_abi_cxx11_(this_00,(iterator)local_38._M_node);
  }
  oid_local.data_.size_._7_1_ = !bVar1;
  return oid_local.data_.size_._7_1_;
}

Assistant:

OPENSSL_EXPORT bool ConsumeExtension(
    der::Input oid,
    std::map<der::Input, ParsedExtension> *unconsumed_extensions,
    ParsedExtension *extension) {
  auto it = unconsumed_extensions->find(oid);
  if (it == unconsumed_extensions->end()) {
    return false;
  }

  *extension = it->second;
  unconsumed_extensions->erase(it);
  return true;
}